

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenumberarea.h
# Opt level: O3

int __thiscall LineNumArea::lineNumAreaWidth(LineNumArea *this)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  QFontMetrics local_20 [8];
  
  iVar4 = 0;
  if (this->enabled == true) {
    uVar3 = QPlainTextEdit::blockCount();
    iVar4 = 2;
    if (9 < (int)uVar3) {
      do {
        uVar1 = (uint)uVar3;
        uVar3 = (uVar3 & 0xffffffff) / 10;
        iVar4 = iVar4 + 1;
      } while (99 < uVar1);
    }
    QFontMetrics::QFontMetrics(local_20,(QFont *)(*(long *)&this->textEdit->field_0x20 + 0x38));
    iVar2 = QFontMetrics::horizontalAdvance((QChar)(char16_t)local_20);
    iVar4 = iVar2 * iVar4 + 0xd;
    QFontMetrics::~QFontMetrics(local_20);
  }
  return iVar4;
}

Assistant:

int lineNumAreaWidth() const
    {
        if (!enabled) {
            return 0;
        }

        int digits = 2;
        int max = std::max(1, textEdit->blockCount());
        while (max >= 10) {
            max /= 10;
            ++digits;
        }

#if QT_VERSION >= 0x050B00
        int space = 13 + textEdit->fontMetrics().horizontalAdvance(u'9') * digits;
#else
        int space = 13 + textEdit->fontMetrics().width(QLatin1Char('9')) * digits;
#endif

        return space;
    }